

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O1

void duckdb::ListHasAnyFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined1 *puVar3;
  long lVar4;
  ulong *puVar5;
  long lVar6;
  __buckets_ptr pp_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  char cVar11;
  char cVar12;
  reference vector;
  reference vector_00;
  LogicalType *pLVar13;
  UnifiedVectorFormat *pUVar14;
  UnifiedVectorFormat *pUVar15;
  Vector *pVVar16;
  Vector *pVVar17;
  UnifiedVectorFormat *pUVar18;
  iterator iVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  ulong uVar21;
  long lVar22;
  uint64_t idx_5;
  UnifiedVectorFormat *pUVar23;
  long lVar24;
  long lVar25;
  uint64_t idx_2;
  ulong uVar26;
  VectorType VVar27;
  uint64_t idx_14;
  ulong uVar28;
  uint64_t idx;
  ulong uVar29;
  ulong uVar30;
  uint64_t idx_1;
  ulong uVar31;
  uint64_t idx_3;
  UnifiedVectorFormat *pUVar32;
  ulong uVar33;
  UnifiedVectorFormat UVar34;
  bool bVar35;
  string_set_t set;
  UnifiedVectorFormat r_child_format;
  UnifiedVectorFormat l_child_format;
  UnifiedVectorFormat ldata;
  Vector l_sortkey_vec;
  Vector r_sortkey_vec;
  UnifiedVectorFormat *local_338;
  UnifiedVectorFormat *local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_300;
  ulong local_2f0;
  long local_2e8;
  UnifiedVectorFormat *local_2e0;
  ulong local_2d0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2c0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  UnifiedVectorFormat local_270 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  UnifiedVectorFormat local_228 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_1e0;
  long local_1d8;
  long local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  unsigned_long local_198;
  LogicalType local_190 [24];
  LogicalType local_178 [24];
  LogicalType local_160 [24];
  long *local_148;
  long local_140;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  LogicalType local_100 [8];
  LogicalType local_f8 [24];
  long local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [24];
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pLVar13 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(vector + 8));
  duckdb::LogicalType::LogicalType(local_100,SQLNULL);
  cVar11 = duckdb::LogicalType::operator==(pLVar13,local_100);
  cVar12 = '\x01';
  if (cVar11 == '\0') {
    pLVar13 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(vector_00 + 8));
    duckdb::LogicalType::LogicalType(local_160,SQLNULL);
    cVar12 = duckdb::LogicalType::operator==(pLVar13,local_160);
    duckdb::LogicalType::~LogicalType(local_160);
  }
  duckdb::LogicalType::~LogicalType(local_100);
  VVar27 = (VectorType)result;
  if (cVar12 != '\0') {
    duckdb::Vector::SetVectorType(VVar27);
    **(undefined1 **)(result + 0x20) = 0;
    return;
  }
  pUVar14 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(vector);
  pUVar15 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(vector_00);
  pVVar16 = (Vector *)duckdb::ListVector::GetEntry(vector);
  pVVar17 = (Vector *)duckdb::ListVector::GetEntry(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_228);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_270);
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar16,pUVar14);
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar17,pUVar15);
  duckdb::LogicalType::LogicalType(local_178,BLOB);
  duckdb::Vector::Vector((Vector *)local_100,local_178,pUVar14);
  duckdb::LogicalType::~LogicalType(local_178);
  duckdb::LogicalType::LogicalType(local_190,BLOB);
  duckdb::Vector::Vector(local_98,local_190,pUVar15);
  duckdb::LogicalType::~LogicalType(local_190);
  duckdb::CreateSortKeyHelpers::CreateSortKey
            (pVVar16,(ulong)pUVar14,(OrderModifiers)0x302,(Vector *)local_100);
  duckdb::CreateSortKeyHelpers::CreateSortKey(pVVar17,(ulong)pUVar15,(OrderModifiers)0x302,local_98)
  ;
  local_320 = local_78;
  local_2c0._M_buckets = &local_2c0._M_single_bucket;
  local_2c0._M_bucket_count = 1;
  local_2c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2c0._M_element_count = 0;
  local_2c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2c0._M_rehash_policy._M_next_resize = 0;
  local_2c0._M_single_bucket = (__node_base_ptr)0x0;
  vVar1 = *vector;
  vVar2 = *vector_00;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar27);
    puVar3 = *(undefined1 **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      uVar21 = (*(ulong **)(vector + 0x20))[1];
      bVar35 = false;
      if ((uVar21 != 0) && (uVar33 = (*(ulong **)(vector_00 + 0x20))[1], uVar33 != 0)) {
        uVar29 = **(ulong **)(vector + 0x20);
        uVar31 = **(ulong **)(vector_00 + 0x20);
        if (uVar33 < uVar21) {
          local_330 = local_228;
          pUVar14 = local_270;
          local_338 = (UnifiedVectorFormat *)local_78;
          local_320 = local_e0;
          uVar26 = uVar33;
          uVar30 = uVar31;
          uVar31 = uVar29;
          uVar33 = uVar21;
        }
        else {
          local_330 = local_270;
          pUVar14 = local_228;
          local_338 = (UnifiedVectorFormat *)local_e0;
          uVar26 = uVar21;
          uVar30 = uVar29;
        }
        std::
        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&local_2c0);
        if (uVar30 < uVar26 + uVar30) {
          do {
            uVar21 = uVar30;
            if (**(long **)pUVar14 != 0) {
              uVar21 = (ulong)*(uint *)(**(long **)pUVar14 + uVar30 * 4);
            }
            if ((*(long *)(pUVar14 + 0x10) == 0) ||
               ((*(ulong *)(*(long *)(pUVar14 + 0x10) + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1)
                != 0)) {
              local_1e0 = &local_2c0;
              std::
              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_2c0,uVar21 * 0x10 + (long)local_338,&local_1e0);
            }
            uVar30 = uVar30 + 1;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
        }
        bVar35 = uVar31 < uVar33 + uVar31;
        if (bVar35) {
          do {
            uVar21 = uVar31;
            if (**(long **)local_330 != 0) {
              uVar21 = (ulong)*(uint *)(**(long **)local_330 + uVar31 * 4);
            }
            if (((*(long *)(local_330 + 0x10) == 0) ||
                ((*(ulong *)(*(long *)(local_330 + 0x10) + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1
                 ) != 0)) &&
               (iVar19 = std::
                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&local_2c0,(key_type *)(uVar21 * 0x10 + local_320)),
               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur != (__node_type *)0x0
               )) {
              bVar35 = true;
              goto LAB_00685c2f;
            }
            uVar31 = uVar31 + 1;
            uVar33 = uVar33 - 1;
          } while (uVar33 != 0);
          bVar35 = false;
        }
      }
LAB_00685c2f:
      *puVar3 = bVar35;
      goto LAB_00685c33;
    }
  }
  else {
    pUVar14 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      puVar5 = *(ulong **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar27);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar14 != (UnifiedVectorFormat *)0x0) {
            uVar21 = *puVar5;
            uVar33 = puVar5[1];
            pUVar15 = (UnifiedVectorFormat *)0x0;
            do {
              uVar29 = *(ulong *)(lVar4 + 8 + (long)pUVar15 * 0x10);
              UVar34 = (UnifiedVectorFormat)0x0;
              if ((uVar29 != 0) && (uVar33 != 0)) {
                uVar31 = *(ulong *)(lVar4 + (long)pUVar15 * 0x10);
                if (uVar33 < uVar29) {
                  local_328 = local_e0;
                  pUVar18 = local_270;
                  local_330 = local_228;
                  uVar26 = uVar21;
                  uVar30 = uVar29;
                  lVar24 = local_78;
                  uVar29 = uVar33;
                }
                else {
                  local_328 = local_78;
                  pUVar18 = local_228;
                  local_330 = local_270;
                  uVar26 = uVar31;
                  uVar30 = uVar33;
                  lVar24 = local_e0;
                  uVar31 = uVar21;
                }
                std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_2c0);
                if (uVar26 < uVar29 + uVar26) {
                  do {
                    uVar28 = uVar26;
                    if (**(long **)pUVar18 != 0) {
                      uVar28 = (ulong)*(uint *)(**(long **)pUVar18 + uVar26 * 4);
                    }
                    if ((*(long *)(pUVar18 + 0x10) == 0) ||
                       ((*(ulong *)(*(long *)(pUVar18 + 0x10) + (uVar28 >> 6) * 8) >>
                         (uVar28 & 0x3f) & 1) != 0)) {
                      local_1e0 = &local_2c0;
                      std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)local_1e0,uVar28 * 0x10 + lVar24,&local_1e0);
                    }
                    uVar26 = uVar26 + 1;
                    uVar29 = uVar29 - 1;
                  } while (uVar29 != 0);
                }
                UVar34 = (UnifiedVectorFormat)(uVar31 < uVar31 + uVar30);
                if ((bool)UVar34) {
                  do {
                    uVar29 = uVar31;
                    if (**(long **)local_330 != 0) {
                      uVar29 = (ulong)*(uint *)(**(long **)local_330 + uVar31 * 4);
                    }
                    if (((*(long *)(local_330 + 0x10) == 0) ||
                        ((*(ulong *)(*(long *)(local_330 + 0x10) + (uVar29 >> 6) * 8) >>
                          (uVar29 & 0x3f) & 1) != 0)) &&
                       (iVar19 = std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_2c0,(key_type *)(uVar29 * 0x10 + local_328)),
                       iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                       (__node_type *)0x0)) {
                      UVar34 = (UnifiedVectorFormat)0x1;
                      goto LAB_006851bd;
                    }
                    uVar31 = uVar31 + 1;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                  UVar34 = (UnifiedVectorFormat)0x0;
                }
              }
LAB_006851bd:
              pUVar15[lVar6] = UVar34;
              pUVar15 = pUVar15 + 1;
            } while (pUVar15 != pUVar14);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar14 + 0x3f) {
          pUVar15 = (UnifiedVectorFormat *)0x0;
          local_2d0 = 0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar21 = 0xffffffffffffffff;
            }
            else {
              uVar21 = *(ulong *)(*(long *)(result + 0x28) + local_2d0 * 8);
            }
            pUVar18 = pUVar15 + 0x40;
            if (pUVar14 <= pUVar15 + 0x40) {
              pUVar18 = pUVar14;
            }
            pUVar32 = pUVar18;
            if (uVar21 != 0) {
              pUVar32 = pUVar15;
              if (uVar21 == 0xffffffffffffffff) {
                if (pUVar15 < pUVar18) {
                  uVar21 = *puVar5;
                  uVar33 = puVar5[1];
                  do {
                    uVar29 = *(ulong *)(lVar4 + 8 + (long)pUVar15 * 0x10);
                    UVar34 = (UnifiedVectorFormat)0x0;
                    if ((uVar29 != 0) && (uVar33 != 0)) {
                      uVar31 = *(ulong *)(lVar4 + (long)pUVar15 * 0x10);
                      if (uVar33 < uVar29) {
                        local_300 = local_e0;
                        pUVar32 = local_270;
                        local_338 = local_228;
                        uVar26 = uVar21;
                        uVar30 = uVar33;
                        lVar24 = local_78;
                      }
                      else {
                        local_300 = local_78;
                        pUVar32 = local_228;
                        local_338 = local_270;
                        uVar26 = uVar31;
                        uVar30 = uVar29;
                        uVar29 = uVar33;
                        lVar24 = local_e0;
                        uVar31 = uVar21;
                      }
                      std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_2c0);
                      if (uVar26 < uVar30 + uVar26) {
                        do {
                          uVar28 = uVar26;
                          if (**(long **)pUVar32 != 0) {
                            uVar28 = (ulong)*(uint *)(**(long **)pUVar32 + uVar26 * 4);
                          }
                          if ((*(long *)(pUVar32 + 0x10) == 0) ||
                             ((*(ulong *)(*(long *)(pUVar32 + 0x10) + (uVar28 >> 6) * 8) >>
                               (uVar28 & 0x3f) & 1) != 0)) {
                            local_1e0 = &local_2c0;
                            std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)local_1e0,uVar28 * 0x10 + lVar24,&local_1e0);
                          }
                          uVar26 = uVar26 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      UVar34 = (UnifiedVectorFormat)(uVar31 < uVar31 + uVar29);
                      if ((bool)UVar34) {
                        do {
                          uVar26 = uVar31;
                          if (**(long **)local_338 != 0) {
                            uVar26 = (ulong)*(uint *)(**(long **)local_338 + uVar31 * 4);
                          }
                          if (((*(long *)(local_338 + 0x10) == 0) ||
                              ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar26 >> 6) * 8) >>
                                (uVar26 & 0x3f) & 1) != 0)) &&
                             (iVar19 = std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_2c0,(key_type *)(uVar26 * 0x10 + local_300)),
                             iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                             (__node_type *)0x0)) {
                            UVar34 = (UnifiedVectorFormat)0x1;
                            goto LAB_006846e0;
                          }
                          uVar31 = uVar31 + 1;
                          uVar29 = uVar29 - 1;
                        } while (uVar29 != 0);
                        UVar34 = (UnifiedVectorFormat)0x0;
                      }
                    }
LAB_006846e0:
                    pUVar15[lVar6] = UVar34;
                    pUVar15 = pUVar15 + 1;
                    pUVar32 = pUVar15;
                  } while (pUVar15 != pUVar18);
                }
              }
              else if (pUVar15 < pUVar18) {
                do {
                  if ((uVar21 >> ((ulong)(uint)((int)pUVar32 - (int)pUVar15) & 0x3f) & 1) != 0) {
                    uVar33 = *(ulong *)(lVar4 + 8 + (long)pUVar32 * 0x10);
                    UVar34 = (UnifiedVectorFormat)0x0;
                    if ((uVar33 != 0) && (uVar29 = puVar5[1], uVar29 != 0)) {
                      uVar31 = *(ulong *)(lVar4 + (long)pUVar32 * 0x10);
                      if (uVar29 < uVar33) {
                        local_2f0 = local_e0;
                        pUVar23 = local_270;
                        local_338 = local_228;
                        uVar26 = uVar31;
                        uVar30 = uVar29;
                        uVar29 = uVar33;
                        lVar24 = local_78;
                        uVar31 = *puVar5;
                      }
                      else {
                        local_2f0 = local_78;
                        pUVar23 = local_228;
                        local_338 = local_270;
                        uVar26 = *puVar5;
                        uVar30 = uVar33;
                        lVar24 = local_e0;
                      }
                      std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_2c0);
                      if (uVar31 < uVar30 + uVar31) {
                        do {
                          uVar33 = uVar31;
                          if (**(long **)pUVar23 != 0) {
                            uVar33 = (ulong)*(uint *)(**(long **)pUVar23 + uVar31 * 4);
                          }
                          if ((*(long *)(pUVar23 + 0x10) == 0) ||
                             ((*(ulong *)(*(long *)(pUVar23 + 0x10) + (uVar33 >> 6) * 8) >>
                               (uVar33 & 0x3f) & 1) != 0)) {
                            local_1e0 = &local_2c0;
                            std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)local_1e0,uVar33 * 0x10 + lVar24,&local_1e0);
                          }
                          uVar31 = uVar31 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      UVar34 = (UnifiedVectorFormat)(uVar26 < uVar26 + uVar29);
                      if ((bool)UVar34) {
                        do {
                          uVar33 = uVar26;
                          if (**(long **)local_338 != 0) {
                            uVar33 = (ulong)*(uint *)(**(long **)local_338 + uVar26 * 4);
                          }
                          if (((*(long *)(local_338 + 0x10) == 0) ||
                              ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar33 >> 6) * 8) >>
                                (uVar33 & 0x3f) & 1) != 0)) &&
                             (iVar19 = std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_2c0,(key_type *)(uVar33 * 0x10 + local_2f0)),
                             iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                             (__node_type *)0x0)) {
                            UVar34 = (UnifiedVectorFormat)0x1;
                            goto LAB_006848a5;
                          }
                          uVar26 = uVar26 + 1;
                          uVar29 = uVar29 - 1;
                        } while (uVar29 != 0);
                        UVar34 = (UnifiedVectorFormat)0x0;
                      }
                    }
LAB_006848a5:
                    pUVar32[lVar6] = UVar34;
                  }
                  pUVar32 = pUVar32 + 1;
                } while (pUVar32 != pUVar18);
              }
            }
            pUVar15 = pUVar32;
            local_2d0 = local_2d0 + 1;
          } while (local_2d0 != (ulong)(pUVar14 + 0x3f) >> 6);
        }
        goto LAB_00685c33;
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar27);
          lVar24 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          pVVar16 = result + 0x28;
          duckdb::ValidityMask::Combine((ValidityMask *)pVVar16,(ulong)(vector_00 + 0x28));
          if (*(long *)pVVar16 == 0) {
            if (pUVar14 != (UnifiedVectorFormat *)0x0) {
              pUVar15 = (UnifiedVectorFormat *)0x0;
              do {
                lVar22 = (long)pUVar15 * 0x10;
                uVar21 = *(ulong *)(lVar4 + 8 + lVar22);
                UVar34 = (UnifiedVectorFormat)0x0;
                if ((uVar21 != 0) && (uVar33 = *(ulong *)(lVar6 + 8 + lVar22), uVar33 != 0)) {
                  uVar29 = *(ulong *)(lVar6 + lVar22);
                  if (uVar33 < uVar21) {
                    local_328 = local_e0;
                    pUVar18 = local_270;
                    local_330 = local_228;
                    lVar25 = local_78;
                    uVar31 = uVar29;
                    uVar26 = uVar21;
                    uVar29 = *(ulong *)(lVar4 + lVar22);
                    uVar21 = uVar33;
                  }
                  else {
                    local_328 = local_78;
                    pUVar18 = local_228;
                    local_330 = local_270;
                    lVar25 = local_e0;
                    uVar31 = *(ulong *)(lVar4 + lVar22);
                    uVar26 = uVar33;
                  }
                  std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_2c0);
                  if (uVar31 < uVar21 + uVar31) {
                    do {
                      uVar33 = uVar31;
                      if (**(long **)pUVar18 != 0) {
                        uVar33 = (ulong)*(uint *)(**(long **)pUVar18 + uVar31 * 4);
                      }
                      if ((*(long *)(pUVar18 + 0x10) == 0) ||
                         ((*(ulong *)(*(long *)(pUVar18 + 0x10) + (uVar33 >> 6) * 8) >>
                           (uVar33 & 0x3f) & 1) != 0)) {
                        local_1e0 = &local_2c0;
                        std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)local_1e0,uVar33 * 0x10 + lVar25,&local_1e0);
                      }
                      uVar31 = uVar31 + 1;
                      uVar21 = uVar21 - 1;
                    } while (uVar21 != 0);
                  }
                  UVar34 = (UnifiedVectorFormat)(uVar29 < uVar26 + uVar29);
                  if ((bool)UVar34) {
                    do {
                      uVar21 = uVar29;
                      if (**(long **)local_330 != 0) {
                        uVar21 = (ulong)*(uint *)(**(long **)local_330 + uVar29 * 4);
                      }
                      if (((*(long *)(local_330 + 0x10) == 0) ||
                          ((*(ulong *)(*(long *)(local_330 + 0x10) + (uVar21 >> 6) * 8) >>
                            (uVar21 & 0x3f) & 1) != 0)) &&
                         (iVar19 = std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_2c0,(key_type *)(uVar21 * 0x10 + local_328)),
                         iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                         (__node_type *)0x0)) {
                        UVar34 = (UnifiedVectorFormat)0x1;
                        goto LAB_00685e9f;
                      }
                      uVar29 = uVar29 + 1;
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                    UVar34 = (UnifiedVectorFormat)0x0;
                  }
                }
LAB_00685e9f:
                pUVar15[lVar24] = UVar34;
                pUVar15 = pUVar15 + 1;
              } while (pUVar15 != pUVar14);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar14 + 0x3f) {
            pUVar15 = (UnifiedVectorFormat *)0x0;
            local_2f0 = 0;
            do {
              if (*(long *)pVVar16 == 0) {
                uVar21 = 0xffffffffffffffff;
              }
              else {
                uVar21 = *(ulong *)(*(long *)pVVar16 + local_2f0 * 8);
              }
              pUVar18 = pUVar15 + 0x40;
              if (pUVar14 <= pUVar15 + 0x40) {
                pUVar18 = pUVar14;
              }
              pUVar32 = pUVar18;
              if (uVar21 != 0) {
                pUVar32 = pUVar15;
                if (uVar21 == 0xffffffffffffffff) {
                  if (pUVar15 < pUVar18) {
                    do {
                      lVar22 = (long)pUVar15 * 0x10;
                      uVar21 = *(ulong *)(lVar4 + 8 + lVar22);
                      UVar34 = (UnifiedVectorFormat)0x0;
                      if ((uVar21 != 0) && (uVar33 = *(ulong *)(lVar6 + 8 + lVar22), uVar33 != 0)) {
                        uVar29 = *(ulong *)(lVar6 + lVar22);
                        if (uVar33 < uVar21) {
                          local_2e8 = local_e0;
                          pUVar32 = local_270;
                          local_338 = local_228;
                          uVar31 = uVar21;
                          uVar21 = uVar33;
                          uVar33 = uVar29;
                          lVar25 = local_78;
                          uVar29 = *(ulong *)(lVar4 + lVar22);
                        }
                        else {
                          local_2e8 = local_78;
                          pUVar32 = local_228;
                          local_338 = local_270;
                          uVar31 = uVar33;
                          uVar33 = *(ulong *)(lVar4 + lVar22);
                          lVar25 = local_e0;
                        }
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_2c0);
                        if (uVar33 < uVar21 + uVar33) {
                          do {
                            uVar26 = uVar33;
                            if (**(long **)pUVar32 != 0) {
                              uVar26 = (ulong)*(uint *)(**(long **)pUVar32 + uVar33 * 4);
                            }
                            if ((*(long *)(pUVar32 + 0x10) == 0) ||
                               ((*(ulong *)(*(long *)(pUVar32 + 0x10) + (uVar26 >> 6) * 8) >>
                                 (uVar26 & 0x3f) & 1) != 0)) {
                              local_1e0 = &local_2c0;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)local_1e0,uVar26 * 0x10 + lVar25,&local_1e0);
                            }
                            uVar33 = uVar33 + 1;
                            uVar21 = uVar21 - 1;
                          } while (uVar21 != 0);
                        }
                        UVar34 = (UnifiedVectorFormat)(uVar29 < uVar29 + uVar31);
                        if ((bool)UVar34) {
                          do {
                            uVar21 = uVar29;
                            if (**(long **)local_338 != 0) {
                              uVar21 = (ulong)*(uint *)(**(long **)local_338 + uVar29 * 4);
                            }
                            if (((*(long *)(local_338 + 0x10) == 0) ||
                                ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar21 >> 6) * 8) >>
                                  (uVar21 & 0x3f) & 1) != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_2c0,(key_type *)(uVar21 * 0x10 + local_2e8)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                               (__node_type *)0x0)) {
                              UVar34 = (UnifiedVectorFormat)0x1;
                              goto LAB_00685563;
                            }
                            uVar29 = uVar29 + 1;
                            uVar31 = uVar31 - 1;
                          } while (uVar31 != 0);
                          UVar34 = (UnifiedVectorFormat)0x0;
                        }
                      }
LAB_00685563:
                      pUVar15[lVar24] = UVar34;
                      pUVar15 = pUVar15 + 1;
                      pUVar32 = pUVar15;
                    } while (pUVar15 != pUVar18);
                  }
                }
                else if (pUVar15 < pUVar18) {
                  do {
                    if ((uVar21 >> ((ulong)(uint)((int)pUVar32 - (int)pUVar15) & 0x3f) & 1) != 0) {
                      lVar22 = (long)pUVar32 * 0x10;
                      uVar33 = *(ulong *)(lVar4 + 8 + lVar22);
                      UVar34 = (UnifiedVectorFormat)0x0;
                      if ((uVar33 != 0) && (uVar29 = *(ulong *)(lVar6 + 8 + lVar22), uVar29 != 0)) {
                        uVar31 = *(ulong *)(lVar4 + lVar22);
                        if (uVar29 < uVar33) {
                          local_2e0 = (UnifiedVectorFormat *)local_e0;
                          pUVar23 = local_270;
                          local_338 = local_228;
                          uVar26 = uVar33;
                          uVar33 = uVar29;
                          uVar29 = uVar31;
                          lVar25 = local_78;
                          uVar31 = *(ulong *)(lVar6 + lVar22);
                        }
                        else {
                          local_2e0 = (UnifiedVectorFormat *)local_78;
                          pUVar23 = local_228;
                          local_338 = local_270;
                          uVar26 = uVar29;
                          uVar29 = *(ulong *)(lVar6 + lVar22);
                          lVar25 = local_e0;
                        }
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_2c0);
                        if (uVar31 < uVar33 + uVar31) {
                          do {
                            uVar30 = uVar31;
                            if (**(long **)pUVar23 != 0) {
                              uVar30 = (ulong)*(uint *)(**(long **)pUVar23 + uVar31 * 4);
                            }
                            if ((*(long *)(pUVar23 + 0x10) == 0) ||
                               ((*(ulong *)(*(long *)(pUVar23 + 0x10) + (uVar30 >> 6) * 8) >>
                                 (uVar30 & 0x3f) & 1) != 0)) {
                              local_1e0 = &local_2c0;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)local_1e0,uVar30 * 0x10 + lVar25,&local_1e0);
                            }
                            uVar31 = uVar31 + 1;
                            uVar33 = uVar33 - 1;
                          } while (uVar33 != 0);
                        }
                        UVar34 = (UnifiedVectorFormat)(uVar29 < uVar26 + uVar29);
                        if ((bool)UVar34) {
                          do {
                            uVar33 = uVar29;
                            if (**(long **)local_338 != 0) {
                              uVar33 = (ulong)*(uint *)(**(long **)local_338 + uVar29 * 4);
                            }
                            if (((*(long *)(local_338 + 0x10) == 0) ||
                                ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar33 >> 6) * 8) >>
                                  (uVar33 & 0x3f) & 1) != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_2c0,
                                                (key_type *)(uVar33 * 0x10 + (long)local_2e0)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                               (__node_type *)0x0)) {
                              UVar34 = (UnifiedVectorFormat)0x1;
                              goto LAB_00685728;
                            }
                            uVar29 = uVar29 + 1;
                            uVar26 = uVar26 - 1;
                          } while (uVar26 != 0);
                          UVar34 = (UnifiedVectorFormat)0x0;
                        }
                      }
LAB_00685728:
                      pUVar32[lVar24] = UVar34;
                    }
                    pUVar32 = pUVar32 + 1;
                  } while (pUVar32 != pUVar18);
                }
              }
              pUVar15 = pUVar32;
              local_2f0 = local_2f0 + 1;
            } while (local_2f0 != (ulong)(pUVar14 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1e0);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_148);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar14);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar14);
          duckdb::Vector::SetVectorType(VVar27);
          p_Var9 = local_1e0;
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_138 == 0 && local_1d0 == 0) {
            if (pUVar14 != (UnifiedVectorFormat *)0x0) {
              pp_Var7 = p_Var9->_M_buckets;
              lVar6 = *local_148;
              pUVar15 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar18 = pUVar15;
                if (pp_Var7 != (__buckets_ptr)0x0) {
                  pUVar18 = (UnifiedVectorFormat *)
                            (ulong)*(uint *)((long)pp_Var7 + (long)pUVar15 * 4);
                }
                pUVar32 = pUVar15;
                if (lVar6 != 0) {
                  pUVar32 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar15 * 4);
                }
                uVar21 = *(ulong *)(local_1d8 + 8 + (long)pUVar18 * 0x10);
                UVar34 = (UnifiedVectorFormat)0x0;
                if (uVar21 != 0) {
                  uVar33 = *(ulong *)(local_140 + 8 + (long)pUVar32 * 0x10);
                  if (uVar33 != 0) {
                    uVar29 = *(ulong *)(local_1d8 + (long)pUVar18 * 0x10);
                    uVar31 = *(ulong *)(local_140 + (long)pUVar32 * 0x10);
                    if (uVar33 < uVar21) {
                      local_318 = local_e0;
                      pUVar18 = local_270;
                      local_338 = local_228;
                      uVar26 = uVar21;
                      lVar24 = local_78;
                      uVar30 = uVar31;
                      uVar31 = uVar29;
                      uVar21 = uVar33;
                    }
                    else {
                      local_318 = local_78;
                      pUVar18 = local_228;
                      local_338 = local_270;
                      uVar26 = uVar33;
                      lVar24 = local_e0;
                      uVar30 = uVar29;
                    }
                    std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_2c0);
                    if (uVar30 < uVar21 + uVar30) {
                      do {
                        uVar33 = uVar30;
                        if (**(long **)pUVar18 != 0) {
                          uVar33 = (ulong)*(uint *)(**(long **)pUVar18 + uVar30 * 4);
                        }
                        if ((*(long *)(pUVar18 + 0x10) == 0) ||
                           ((*(ulong *)(*(long *)(pUVar18 + 0x10) + (uVar33 >> 6) * 8) >>
                             (uVar33 & 0x3f) & 1) != 0)) {
                          local_288 = &local_2c0;
                          std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)local_288,uVar33 * 0x10 + lVar24,&local_288);
                        }
                        uVar30 = uVar30 + 1;
                        uVar21 = uVar21 - 1;
                      } while (uVar21 != 0);
                    }
                    UVar34 = (UnifiedVectorFormat)(uVar31 < uVar26 + uVar31);
                    if ((bool)UVar34) {
                      do {
                        uVar21 = uVar31;
                        if (**(long **)local_338 != 0) {
                          uVar21 = (ulong)*(uint *)(**(long **)local_338 + uVar31 * 4);
                        }
                        if (((*(long *)(local_338 + 0x10) == 0) ||
                            ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar21 >> 6) * 8) >>
                              (uVar21 & 0x3f) & 1) != 0)) &&
                           (iVar19 = std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_2c0,(key_type *)(uVar21 * 0x10 + local_318)),
                           iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                           (__node_type *)0x0)) {
                          UVar34 = (UnifiedVectorFormat)0x1;
                          goto LAB_00684b99;
                        }
                        uVar31 = uVar31 + 1;
                        uVar26 = uVar26 - 1;
                      } while (uVar26 != 0);
                      UVar34 = (UnifiedVectorFormat)0x0;
                    }
                  }
                }
LAB_00684b99:
                pUVar15[lVar4] = UVar34;
                pUVar15 = pUVar15 + 1;
              } while (pUVar15 != pUVar14);
            }
          }
          else if (pUVar14 != (UnifiedVectorFormat *)0x0) {
            pp_Var7 = p_Var9->_M_buckets;
            lVar6 = *local_148;
            pUVar15 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar18 = pUVar15;
              if (pp_Var7 != (__buckets_ptr)0x0) {
                pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)((long)pp_Var7 + (long)pUVar15 * 4)
                ;
              }
              pUVar32 = pUVar15;
              if (lVar6 != 0) {
                pUVar32 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar15 * 4);
              }
              if (((local_1d0 == 0) ||
                  ((*(ulong *)(local_1d0 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) & 1
                   ) != 0)) &&
                 ((local_138 == 0 ||
                  ((*(ulong *)(local_138 + ((ulong)pUVar32 >> 6) * 8) >> ((ulong)pUVar32 & 0x3f) & 1
                   ) != 0)))) {
                uVar21 = *(ulong *)(local_1d8 + 8 + (long)pUVar18 * 0x10);
                UVar34 = (UnifiedVectorFormat)0x0;
                if (uVar21 != 0) {
                  uVar33 = *(ulong *)(local_140 + 8 + (long)pUVar32 * 0x10);
                  if (uVar33 != 0) {
                    uVar29 = *(ulong *)(local_1d8 + (long)pUVar18 * 0x10);
                    uVar31 = *(ulong *)(local_140 + (long)pUVar32 * 0x10);
                    if (uVar33 < uVar21) {
                      local_2e8 = local_e0;
                      pUVar18 = local_270;
                      local_2e0 = local_228;
                      lVar24 = local_78;
                      uVar26 = uVar31;
                      uVar31 = uVar29;
                      uVar29 = uVar21;
                      uVar21 = uVar33;
                    }
                    else {
                      local_2e8 = local_78;
                      pUVar18 = local_228;
                      local_2e0 = local_270;
                      lVar24 = local_e0;
                      uVar26 = uVar29;
                      uVar29 = uVar33;
                    }
                    std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_2c0);
                    if (uVar26 < uVar21 + uVar26) {
                      do {
                        uVar33 = uVar26;
                        if (**(long **)pUVar18 != 0) {
                          uVar33 = (ulong)*(uint *)(**(long **)pUVar18 + uVar26 * 4);
                        }
                        if ((*(long *)(pUVar18 + 0x10) == 0) ||
                           ((*(ulong *)(*(long *)(pUVar18 + 0x10) + (uVar33 >> 6) * 8) >>
                             (uVar33 & 0x3f) & 1) != 0)) {
                          local_288 = &local_2c0;
                          std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)local_288,uVar33 * 0x10 + lVar24,&local_288);
                        }
                        uVar26 = uVar26 + 1;
                        uVar21 = uVar21 - 1;
                      } while (uVar21 != 0);
                    }
                    UVar34 = (UnifiedVectorFormat)(uVar31 < uVar29 + uVar31);
                    if ((bool)UVar34) {
                      do {
                        uVar21 = uVar31;
                        if (**(long **)local_2e0 != 0) {
                          uVar21 = (ulong)*(uint *)(**(long **)local_2e0 + uVar31 * 4);
                        }
                        if (((*(long *)(local_2e0 + 0x10) == 0) ||
                            ((*(ulong *)(*(long *)(local_2e0 + 0x10) + (uVar21 >> 6) * 8) >>
                              (uVar21 & 0x3f) & 1) != 0)) &&
                           (iVar19 = std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_2c0,(key_type *)(uVar21 * 0x10 + local_2e8)),
                           iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                           (__node_type *)0x0)) {
                          UVar34 = (UnifiedVectorFormat)0x1;
                          goto LAB_00685a0c;
                        }
                        uVar31 = uVar31 + 1;
                        uVar29 = uVar29 - 1;
                      } while (uVar29 != 0);
                      UVar34 = (UnifiedVectorFormat)0x0;
                    }
                  }
                }
LAB_00685a0c:
                pUVar15[lVar4] = UVar34;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_198 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_288,&local_198);
                  p_Var10 = p_Stack_280;
                  p_Var9 = local_288;
                  local_288 = (_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)0x0;
                  p_Stack_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    **)(result + 0x30) = p_Var9;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_280);
                  }
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar8 = (byte)pUVar15 & 0x3f;
                puVar5 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar15 >> 6) * 8);
                *puVar5 = *puVar5 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              pUVar15 = pUVar15 + 1;
            } while (pUVar15 != pUVar14);
          }
          if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
          }
          if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
          }
          if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
          }
          if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
          }
        }
        goto LAB_00685c33;
      }
      puVar5 = *(ulong **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar27);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar14 != (UnifiedVectorFormat *)0x0) {
            uVar21 = *puVar5;
            uVar33 = puVar5[1];
            pUVar15 = (UnifiedVectorFormat *)0x0;
            do {
              UVar34 = (UnifiedVectorFormat)0x0;
              if (uVar33 != 0) {
                uVar29 = *(ulong *)(lVar4 + 8 + (long)pUVar15 * 0x10);
                UVar34 = (UnifiedVectorFormat)0x0;
                if (uVar29 != 0) {
                  uVar31 = *(ulong *)(lVar4 + (long)pUVar15 * 0x10);
                  if (uVar29 < uVar33) {
                    local_328 = local_e0;
                    pUVar18 = local_270;
                    local_330 = local_228;
                    uVar26 = uVar31;
                    uVar30 = uVar33;
                    lVar24 = local_78;
                    uVar31 = uVar21;
                  }
                  else {
                    local_328 = local_78;
                    pUVar18 = local_228;
                    local_330 = local_270;
                    uVar26 = uVar21;
                    uVar30 = uVar29;
                    lVar24 = local_e0;
                    uVar29 = uVar33;
                  }
                  std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_2c0);
                  if (uVar26 < uVar29 + uVar26) {
                    do {
                      uVar28 = uVar26;
                      if (**(long **)pUVar18 != 0) {
                        uVar28 = (ulong)*(uint *)(**(long **)pUVar18 + uVar26 * 4);
                      }
                      if ((*(long *)(pUVar18 + 0x10) == 0) ||
                         ((*(ulong *)(*(long *)(pUVar18 + 0x10) + (uVar28 >> 6) * 8) >>
                           (uVar28 & 0x3f) & 1) != 0)) {
                        local_1e0 = &local_2c0;
                        std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)local_1e0,uVar28 * 0x10 + lVar24,&local_1e0);
                      }
                      uVar26 = uVar26 + 1;
                      uVar29 = uVar29 - 1;
                    } while (uVar29 != 0);
                  }
                  UVar34 = (UnifiedVectorFormat)(uVar31 < uVar31 + uVar30);
                  if ((bool)UVar34) {
                    do {
                      uVar29 = uVar31;
                      if (**(long **)local_330 != 0) {
                        uVar29 = (ulong)*(uint *)(**(long **)local_330 + uVar31 * 4);
                      }
                      if (((*(long *)(local_330 + 0x10) == 0) ||
                          ((*(ulong *)(*(long *)(local_330 + 0x10) + (uVar29 >> 6) * 8) >>
                            (uVar29 & 0x3f) & 1) != 0)) &&
                         (iVar19 = std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_2c0,(key_type *)(uVar29 * 0x10 + local_328)),
                         iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                         (__node_type *)0x0)) {
                        UVar34 = (UnifiedVectorFormat)0x1;
                        goto LAB_00685c0f;
                      }
                      uVar31 = uVar31 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                    UVar34 = (UnifiedVectorFormat)0x0;
                  }
                }
              }
LAB_00685c0f:
              pUVar15[lVar6] = UVar34;
              pUVar15 = pUVar15 + 1;
            } while (pUVar15 != pUVar14);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar14 + 0x3f) {
          pUVar15 = (UnifiedVectorFormat *)0x0;
          local_2d0 = 0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar21 = 0xffffffffffffffff;
            }
            else {
              uVar21 = *(ulong *)(*(long *)(result + 0x28) + local_2d0 * 8);
            }
            pUVar18 = pUVar15 + 0x40;
            if (pUVar14 <= pUVar15 + 0x40) {
              pUVar18 = pUVar14;
            }
            pUVar32 = pUVar18;
            if (uVar21 != 0) {
              pUVar32 = pUVar15;
              if (uVar21 == 0xffffffffffffffff) {
                if (pUVar15 < pUVar18) {
                  uVar21 = *puVar5;
                  uVar33 = puVar5[1];
                  do {
                    UVar34 = (UnifiedVectorFormat)0x0;
                    if (uVar33 != 0) {
                      uVar29 = *(ulong *)(lVar4 + 8 + (long)pUVar15 * 0x10);
                      UVar34 = (UnifiedVectorFormat)0x0;
                      if (uVar29 != 0) {
                        uVar31 = *(ulong *)(lVar4 + (long)pUVar15 * 0x10);
                        if (uVar29 < uVar33) {
                          local_2e0 = (UnifiedVectorFormat *)local_e0;
                          pUVar32 = local_270;
                          local_338 = local_228;
                          uVar26 = uVar31;
                          uVar30 = uVar29;
                          uVar29 = uVar33;
                          lVar24 = local_78;
                          uVar31 = uVar21;
                        }
                        else {
                          local_2e0 = (UnifiedVectorFormat *)local_78;
                          pUVar32 = local_228;
                          local_338 = local_270;
                          uVar26 = uVar21;
                          uVar30 = uVar33;
                          lVar24 = local_e0;
                        }
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_2c0);
                        if (uVar26 < uVar30 + uVar26) {
                          do {
                            uVar28 = uVar26;
                            if (**(long **)pUVar32 != 0) {
                              uVar28 = (ulong)*(uint *)(**(long **)pUVar32 + uVar26 * 4);
                            }
                            if ((*(long *)(pUVar32 + 0x10) == 0) ||
                               ((*(ulong *)(*(long *)(pUVar32 + 0x10) + (uVar28 >> 6) * 8) >>
                                 (uVar28 & 0x3f) & 1) != 0)) {
                              local_1e0 = &local_2c0;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)local_1e0,uVar28 * 0x10 + lVar24,&local_1e0);
                            }
                            uVar26 = uVar26 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        UVar34 = (UnifiedVectorFormat)(uVar31 < uVar31 + uVar29);
                        if ((bool)UVar34) {
                          do {
                            uVar26 = uVar31;
                            if (**(long **)local_338 != 0) {
                              uVar26 = (ulong)*(uint *)(**(long **)local_338 + uVar31 * 4);
                            }
                            if (((*(long *)(local_338 + 0x10) == 0) ||
                                ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar26 >> 6) * 8) >>
                                  (uVar26 & 0x3f) & 1) != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_2c0,
                                                (key_type *)(uVar26 * 0x10 + (long)local_2e0)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                               (__node_type *)0x0)) {
                              UVar34 = (UnifiedVectorFormat)0x1;
                              goto LAB_00684e17;
                            }
                            uVar31 = uVar31 + 1;
                            uVar29 = uVar29 - 1;
                          } while (uVar29 != 0);
                          UVar34 = (UnifiedVectorFormat)0x0;
                        }
                      }
                    }
LAB_00684e17:
                    pUVar15[lVar6] = UVar34;
                    pUVar15 = pUVar15 + 1;
                    pUVar32 = pUVar15;
                  } while (pUVar15 != pUVar18);
                }
              }
              else if (pUVar15 < pUVar18) {
                do {
                  if ((uVar21 >> ((ulong)(uint)((int)pUVar32 - (int)pUVar15) & 0x3f) & 1) != 0) {
                    uVar33 = puVar5[1];
                    UVar34 = (UnifiedVectorFormat)0x0;
                    if (uVar33 != 0) {
                      uVar29 = *(ulong *)(lVar4 + 8 + (long)pUVar32 * 0x10);
                      if (uVar29 != 0) {
                        uVar31 = *puVar5;
                        uVar26 = *(ulong *)(lVar4 + (long)pUVar32 * 0x10);
                        if (uVar29 < uVar33) {
                          local_2f0 = local_e0;
                          pUVar23 = local_270;
                          local_338 = local_228;
                          uVar30 = uVar31;
                          uVar28 = uVar29;
                          uVar29 = uVar33;
                          lVar24 = local_78;
                          uVar31 = uVar26;
                        }
                        else {
                          local_2f0 = local_78;
                          pUVar23 = local_228;
                          local_338 = local_270;
                          uVar30 = uVar26;
                          uVar28 = uVar33;
                          lVar24 = local_e0;
                        }
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_2c0);
                        if (uVar31 < uVar28 + uVar31) {
                          do {
                            uVar33 = uVar31;
                            if (**(long **)pUVar23 != 0) {
                              uVar33 = (ulong)*(uint *)(**(long **)pUVar23 + uVar31 * 4);
                            }
                            if ((*(long *)(pUVar23 + 0x10) == 0) ||
                               ((*(ulong *)(*(long *)(pUVar23 + 0x10) + (uVar33 >> 6) * 8) >>
                                 (uVar33 & 0x3f) & 1) != 0)) {
                              local_1e0 = &local_2c0;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)local_1e0,uVar33 * 0x10 + lVar24,&local_1e0);
                            }
                            uVar31 = uVar31 + 1;
                            uVar28 = uVar28 - 1;
                          } while (uVar28 != 0);
                        }
                        UVar34 = (UnifiedVectorFormat)(uVar30 < uVar29 + uVar30);
                        if ((bool)UVar34) {
                          do {
                            uVar33 = uVar30;
                            if (**(long **)local_338 != 0) {
                              uVar33 = (ulong)*(uint *)(**(long **)local_338 + uVar30 * 4);
                            }
                            if (((*(long *)(local_338 + 0x10) == 0) ||
                                ((*(ulong *)(*(long *)(local_338 + 0x10) + (uVar33 >> 6) * 8) >>
                                  (uVar33 & 0x3f) & 1) != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_2c0,(key_type *)(uVar33 * 0x10 + local_2f0)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                               (__node_type *)0x0)) {
                              UVar34 = (UnifiedVectorFormat)0x1;
                              goto LAB_00684fe2;
                            }
                            uVar30 = uVar30 + 1;
                            uVar29 = uVar29 - 1;
                          } while (uVar29 != 0);
                          UVar34 = (UnifiedVectorFormat)0x0;
                        }
                      }
                    }
LAB_00684fe2:
                    pUVar32[lVar6] = UVar34;
                  }
                  pUVar32 = pUVar32 + 1;
                } while (pUVar32 != pUVar18);
              }
            }
            pUVar15 = pUVar32;
            local_2d0 = local_2d0 + 1;
          } while (local_2d0 != (ulong)(pUVar14 + 0x3f) >> 6);
        }
        goto LAB_00685c33;
      }
    }
    duckdb::Vector::SetVectorType(VVar27);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_00685c33:
  std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2c0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  duckdb::LogicalType::~LogicalType(local_f8);
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
  }
  return;
}

Assistant:

static void ListHasAnyFunction(DataChunk &args, ExpressionState &, Vector &result) {

	auto &l_vec = args.data[0];
	auto &r_vec = args.data[1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL ||
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = false;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat l_child_format;
	UnifiedVectorFormat r_child_format;

	l_child.ToUnifiedFormat(l_size, l_child_format);
	r_child.ToUnifiedFormat(r_size, r_child_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto l_sortkey_ptr = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto r_sortkey_ptr = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &l_list, const list_entry_t &r_list) {
		    // Short circuit if either list is empty
		    if (l_list.length == 0 || r_list.length == 0) {
			    return false;
		    }

		    auto build_list = l_list;
		    auto probe_list = r_list;

		    auto build_data = l_sortkey_ptr;
		    auto probe_data = r_sortkey_ptr;

		    auto build_format = &l_child_format;
		    auto probe_format = &r_child_format;

		    // Use the smaller list to build the set
		    if (r_list.length < l_list.length) {

			    build_list = r_list;
			    probe_list = l_list;

			    build_data = r_sortkey_ptr;
			    probe_data = l_sortkey_ptr;

			    build_format = &r_child_format;
			    probe_format = &l_child_format;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format->sel->get_index(idx);
			    if (build_format->validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }
		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format->sel->get_index(idx);
			    if (probe_format->validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) != set.end()) {
				    return true;
			    }
		    }
		    return false;
	    });
}